

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

YieldResult * __thiscall
NEST::NESTcalc::GetYieldKr83m
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,double maxTimeSeparation,double minTimeSeparation)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  RandomGen *this_00;
  runtime_error *this_01;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  Wvalue WVar11;
  double local_b8;
  double local_88;
  double dStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  if ((maxTimeSeparation < minTimeSeparation) && ((energy < 32.0 || (32.2 <= energy)))) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"ERROR: min greater than max");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  WVar11 = WorkFunction(density,this->fdetector->molarMass,this->fdetector->OldW13eV);
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  bVar7 = ValidityTests::nearlyEqual(minTimeSeparation,maxTimeSeparation,1e-09);
  local_b8 = maxTimeSeparation;
  if (!bVar7) {
    local_b8 = -999.0;
  }
  bVar7 = ValidityTests::nearlyEqual(minTimeSeparation,maxTimeSeparation,1e-09);
  if (!bVar7) {
    this_00 = RandomGen::rndm();
    local_b8 = RandomGen::rand_exponential(this_00,154.4,minTimeSeparation,maxTimeSeparation);
  }
  dVar1 = 300000.0 / (local_b8 * local_b8) + 69.986;
  dVar2 = 87.0;
  if (dVar1 <= 87.0) {
    dVar2 = dVar1;
  }
  dVar1 = log(1.0 / (dfield * 0.0005823) + 1.0);
  dVar1 = (dVar1 * dfield * -0.0113985225 + dVar2) * 9.4;
  dVar2 = 9400.0 / WVar11.Wq_eV - dVar1;
  dVar3 = 0.0;
  if (0.0 <= dVar2) {
    dVar3 = dVar2;
  }
  uVar8 = SUB84(density,0);
  uVar9 = SUB84(dfield,0);
  (*this->_vptr_NESTcalc[2])(0,uVar8,uVar9,0x3ff0000000000000,&local_88,this);
  dVar2 = local_88;
  (*this->_vptr_NESTcalc[2])(0,uVar8,uVar9,0x3ff0000000000000,&local_50,this);
  dVar4 = local_50;
  local_68 = (double)local_30;
  dStack_60 = (double)uStack_28;
  local_78 = local_40;
  uStack_70 = uStack_38;
  local_88 = local_50;
  dStack_80 = (double)uStack_48;
  (*this->_vptr_NESTcalc[2])(0,uVar8,uVar9,0x3ff0000000000000,&local_50,this);
  dVar5 = local_50;
  local_68 = (double)local_30;
  dStack_60 = (double)uStack_28;
  local_78 = local_40;
  uStack_70 = uStack_38;
  local_88 = local_50;
  dStack_80 = (double)uStack_48;
  (*this->_vptr_NESTcalc[2])(0,uVar8,uVar9,0x3ff0000000000000,&local_50,this);
  dVar6 = local_50;
  local_68 = (double)local_30;
  dStack_60 = (double)uStack_28;
  local_78 = local_40;
  uStack_70 = uStack_38;
  local_88 = local_50;
  dStack_80 = (double)uStack_48;
  (*this->_vptr_NESTcalc[2])(0,uVar8,uVar9,0x3ff0000000000000,&local_50,this);
  local_68 = (double)local_30;
  dStack_60 = (double)uStack_28;
  local_78 = local_40;
  uStack_70 = uStack_38;
  if ((energy <= 9.35) || (local_88 = dVar1, dVar10 = dVar3, 9.45 <= energy)) {
    local_88 = (dVar4 + dVar6 + dVar2 + dVar2) * 0.09 +
               (local_50 + dVar2) * 0.76 + (dVar5 + dVar6 + dVar2) * 0.15;
    dVar10 = 32000.0 / WVar11.Wq_eV - local_88;
    if ((energy < 32.0) || (32.2 <= energy)) {
      local_88 = dVar1 + local_88;
      dVar10 = dVar3 + dVar10;
    }
  }
  dStack_80 = dVar10;
  if (this->fdetector->OldW13eV == false) {
    dStack_80 = dVar10 * 1.08;
    local_88 = (local_88 + dVar10) - dStack_80;
  }
  (*this->_vptr_NESTcalc[0x11])(SUB84(energy,0),uVar8,this);
  uStack_70 = 0x3ff0000000000000;
  dStack_60 = local_b8;
  local_68 = dfield;
  (*this->_vptr_NESTcalc[0xb])(SUB84(energy,0),WVar11.Wq_eV._0_4_,__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldKr83m(double energy, double density,
                                    double dfield, double maxTimeSeparation,
                                    double minTimeSeparation) {
  if (minTimeSeparation > maxTimeSeparation &&
      (energy < 32.0 || energy >= 32.2))
    throw std::runtime_error("ERROR: min greater than max");

  double Nq = -999;
  double Nph = -999;
  double Ne = -999;
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double alpha = wvalue.alpha;
  constexpr double deltaT_ns_halflife = 154.4;
  YieldResult result{};
  double deltaT_ns = -999.;
  if (ValidityTests::nearlyEqual(minTimeSeparation, maxTimeSeparation))
    deltaT_ns = maxTimeSeparation;
  /*if (minTimeSeparation < 100. && energy < 32. &&
      kr83m_reported_low_deltaT == false) {
    kr83m_reported_low_deltaT = true;
    cerr << "\tWARNING! Outside of Kr83m model fit validity region. Details:"
         << " minTimeSeparation is < 100 ns and your input E is 9.4 keV."
         << " Data for separated Kr83m decays do not yet exist for deltaT_ns "
            "<100 ns."
         << " 9.4 & 32.1 keV yields are still summed to physically accurate "
            "result, but individually will be nonsensical."
         << endl;
  }*/

  if (!ValidityTests::nearlyEqual(minTimeSeparation, maxTimeSeparation))
    deltaT_ns = RandomGen::rndm()->rand_exponential(
        deltaT_ns_halflife, minTimeSeparation, maxTimeSeparation);
  double Nq_9 = 9.4e3 / Wq_eV;  // 9.4 keV model
  double a1 = -19.575;          //-11.839 + 78.063 / deltaT_ns;
  if (a1 > 0.) a1 = 0.;
  double a2 = 5.823e-4;  //(0.0015796*deltaT_ns)/(11.55+deltaT_ns);
  double a3 = 69.986 + 3e5 / pow(deltaT_ns, 2.);  // 2.7745e5 and 2
  if (a3 > 87.) a3 = 87.;
  double Nph_9 = 9.4 * (a1 * a2 * dfield * log(1. + 1. / (a2 * dfield)) + a3);
  double Ne_9 = Nq_9 - Nph_9;
  if (Ne_9 < 0.) Ne_9 = 0.;  // can't have negative charge, from either decay
  result = GetYieldGamma(2., density, dfield);
  double Nph_2 = result.PhotonYield;
  double Ne_2 = result.ElectronYield;
  result = GetYieldGamma(10., density, dfield);
  double Nph_10 = result.PhotonYield;
  double Ne_10 = result.ElectronYield;
  result = GetYieldGamma(12., density, dfield);
  double Nph_12 = result.PhotonYield;
  double Ne_12 = result.ElectronYield;
  result = GetYieldGamma(18., density, dfield);
  double Nph_18 = result.PhotonYield;
  double Ne_18 = result.ElectronYield;
  result = GetYieldGamma(30., density, dfield);
  double Nph_30 = result.PhotonYield;
  double Ne_30 = result.ElectronYield;
  double Nph_76 = Nph_30 + Nph_2;
  double Nph_09 = Nph_18 + Nph_10 + Nph_2 + Nph_2;
  double Nph_15 = Nph_18 + Nph_12 + Nph_2;
  // now, add up the 32.1 keV yields
  double Nph_32 = 0.76 * Nph_76 + 0.15 * Nph_15 + 0.09 * Nph_09;
  double Ne_32 = 32e3 / Wq_eV - Nph_32;
  if (energy > 9.35 && energy < 9.45) {
    alpha = 0.;
    Nph = Nph_9;
    Ne = Ne_9;
  } else if (energy >= 32.0 && energy < 32.2) {
    Nph = Nph_32;
    Ne = Ne_32;
  } else {  // merged 41.5 keV decay
    Ne = Ne_9 + Ne_32;
    Nph = Nph_9 + Nph_32;
  }

  result.PhotonYield = Nph;
  result.ElectronYield = Ne;
  if (!fdetector->get_OldW13eV()) {
    Ne *= ZurichEXOQ;
    Nph = (result.PhotonYield + result.ElectronYield) - Ne;
    result.PhotonYield = Nph;
    result.ElectronYield = Ne;
  }
  result.ExcitonRatio = NexONi(energy, density);
  result.Lindhard = 1;
  result.ElectricField = dfield;
  result.DeltaT_Scint = deltaT_ns;
  return YieldResultValidity(
      result, energy, Wq_eV);  // everything needed to calculate fluctuations
}